

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example1.cpp
# Opt level: O1

void __thiscall Example::initializeUniverse(Example *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Example *pEVar2;
  S_Superellipsoid *this_00;
  S_Box *this_01;
  S_Box *this_02;
  S_Box *this_03;
  S_Sphere *this_04;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_05;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined8 local_90;
  double local_88;
  S_Superellipsoid *local_80;
  S_Superellipsoid *local_78;
  S_Sphere *local_70;
  S_Sphere *local_68;
  S_Box *local_60;
  S_Box *local_58;
  S_Superellipsoid *local_50;
  S_Sphere *local_48;
  S_Box *local_40;
  Example *local_38;
  
  local_78 = (S_Superellipsoid *)operator_new(0xd8);
  sch::S_Superellipsoid::S_Superellipsoid(local_78,1.0,0.2,0.5,0.3,0.1);
  local_80 = (S_Superellipsoid *)operator_new(0xd8);
  sch::S_Superellipsoid::S_Superellipsoid(local_80,0.1,0.9,0.3,0.5,0.8);
  this_00 = (S_Superellipsoid *)operator_new(0xd8);
  sch::S_Superellipsoid::S_Superellipsoid(this_00,0.4,0.4,1.7,0.8,0.1);
  this_01 = (S_Box *)operator_new(0xa8);
  sch::S_Box::S_Box(this_01,0.2,0.1,0.4);
  this_02 = (S_Box *)operator_new(0xa8);
  sch::S_Box::S_Box(this_02,2.1,1.1,0.8);
  local_38 = this;
  this_03 = (S_Box *)operator_new(0xa8);
  sch::S_Box::S_Box(this_03,1.4,4.1,1.2);
  this_04 = (S_Sphere *)operator_new(0x98);
  local_b0._M_dataplus._M_p = (pointer)0x3fd3333333333333;
  sch::S_Sphere::S_Sphere(this_04,(double *)&local_b0);
  local_68 = (S_Sphere *)operator_new(0x98);
  local_b0._M_dataplus._M_p = (pointer)0x3fe0000000000000;
  sch::S_Sphere::S_Sphere(local_68,(double *)&local_b0);
  local_60 = this_02;
  local_58 = this_01;
  local_48 = this_04;
  local_40 = this_03;
  local_70 = (S_Sphere *)operator_new(0x98);
  local_b0._M_dataplus._M_p = (pointer)0x3fc999999999999a;
  sch::S_Sphere::S_Sphere(local_70,(double *)&local_b0);
  local_b0._M_dataplus._M_p = (pointer)0x3ff0000000000000;
  local_88 = 0.2;
  local_90 = 0x3fe0000000000000;
  sch::S_Object::setPosition((double *)local_78,(double *)&local_b0,&local_88);
  local_b0._M_dataplus._M_p = (pointer)0xc00199999999999a;
  local_88 = -1.1;
  local_90 = 0x3ff4cccccccccccd;
  sch::S_Object::setPosition((double *)local_80,(double *)&local_b0,&local_88);
  local_b0._M_dataplus._M_p = (pointer)0x3fd999999999999a;
  local_88 = 0.4;
  local_90 = 0xbffb333333333333;
  local_50 = this_00;
  sch::S_Object::setPosition((double *)this_00,(double *)&local_b0,&local_88);
  local_b0._M_dataplus._M_p = (pointer)0xbfc999999999999a;
  local_88 = 0.1;
  local_90 = 0xbfd999999999999a;
  sch::S_Object::setPosition((double *)local_58,(double *)&local_b0,&local_88);
  local_b0._M_dataplus._M_p = (pointer)0xc000cccccccccccd;
  local_88 = -1.1;
  local_90 = 0x3fe999999999999a;
  sch::S_Object::setPosition((double *)local_60,(double *)&local_b0,&local_88);
  local_b0._M_dataplus._M_p = (pointer)0xc000000000000000;
  local_88 = -1.0;
  local_90 = 0x3ff3333333333333;
  sch::S_Object::setPosition((double *)local_40,(double *)&local_b0,&local_88);
  local_b0._M_dataplus._M_p = (pointer)0xc000cccccccccccd;
  local_88 = 1.1;
  local_90 = 0x3fe999999999999a;
  sch::S_Object::setPosition((double *)local_48,(double *)&local_b0,&local_88);
  local_b0._M_dataplus._M_p = (pointer)0x4000cccccccccccd;
  local_88 = 1.1;
  local_90 = 0xbfd999999999999a;
  sch::S_Object::setPosition((double *)local_68,(double *)&local_b0,&local_88);
  local_b0._M_dataplus._M_p = (pointer)0x4002666666666666;
  local_88 = 1.1;
  local_90 = 0xbfe0000000000000;
  sch::S_Object::setPosition((double *)local_70,(double *)&local_b0,&local_88);
  local_b0._M_dataplus._M_p = (pointer)0xc000cccccccccccd;
  local_88 = 1.1;
  local_90 = 0x3fe999999999999a;
  sch::S_Object::setOrientation((double *)local_78,(double *)&local_b0,&local_88);
  local_b0._M_dataplus._M_p = (pointer)0x4000cccccccccccd;
  local_88 = 1.1;
  local_90 = 0xbfd999999999999a;
  sch::S_Object::setOrientation((double *)local_80,(double *)&local_b0,&local_88);
  local_b0._M_dataplus._M_p = (pointer)0x4000cccccccccccd;
  local_88 = 1.1;
  local_90 = 0xbfe0000000000000;
  sch::S_Object::setOrientation((double *)local_50,(double *)&local_b0,&local_88);
  local_b0._M_dataplus._M_p = (pointer)0xbfc999999999999a;
  local_88 = 0.1;
  local_90 = 0xbfd999999999999a;
  sch::S_Object::setOrientation((double *)local_58,(double *)&local_b0,&local_88);
  local_b0._M_dataplus._M_p = (pointer)0xc000cccccccccccd;
  local_88 = -1.1;
  local_90 = 0x3fe999999999999a;
  sch::S_Object::setOrientation((double *)local_60,(double *)&local_b0,&local_88);
  local_b0._M_dataplus._M_p = (pointer)0xc000000000000000;
  local_88 = -1.0;
  local_90 = 0x3ff3333333333333;
  sch::S_Object::setOrientation((double *)local_40,(double *)&local_b0,&local_88);
  local_b0._M_dataplus._M_p = (pointer)0x3ff0000000000000;
  local_88 = 0.2;
  local_90 = 0x3fe0000000000000;
  sch::S_Object::setOrientation((double *)local_48,(double *)&local_b0,&local_88);
  local_b0._M_dataplus._M_p = (pointer)0xc00199999999999a;
  local_88 = -1.1;
  local_90 = 0x3ff4cccccccccccd;
  sch::S_Object::setOrientation((double *)local_68,(double *)&local_b0,&local_88);
  local_b0._M_dataplus._M_p = (pointer)0x3fd999999999999a;
  local_88 = 0.4;
  local_90 = 0xbffb333333333333;
  sch::S_Object::setOrientation((double *)local_70,(double *)&local_b0,&local_88);
  pEVar2 = local_38;
  sch::CD_Scene::addObject((S_Object *)local_38);
  sch::CD_Scene::addObject((S_Object *)pEVar2);
  sch::CD_Scene::addObject((S_Object *)pEVar2);
  sch::CD_Scene::addObject((S_Object *)pEVar2);
  sch::CD_Scene::addObject((S_Object *)pEVar2);
  sch::CD_Scene::addObject((S_Object *)pEVar2);
  sch::CD_Scene::addObject((S_Object *)pEVar2);
  sch::CD_Scene::addObject((S_Object *)pEVar2);
  sch::CD_Scene::addObject((S_Object *)pEVar2);
  paVar1 = &local_b0.field_2;
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"super1","");
  this_05 = &pEVar2->objName;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_05,&local_b0)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"super2","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_05,&local_b0)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"super3","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_05,&local_b0)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"box1","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_05,&local_b0)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"box2","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_05,&local_b0)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"box3","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_05,&local_b0)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"sphere1","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_05,&local_b0)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"sphere2","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_05,&local_b0)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"sphere3","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_05,&local_b0)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Example::initializeUniverse()
{
  //Objects initializations
  S_Superellipsoid * super1 = new S_Superellipsoid (1.0,0.2,0.5,0.3,0.1);
  S_Superellipsoid * super2 = new S_Superellipsoid (0.1,0.9,0.3,0.5,0.8);
  S_Superellipsoid * super3 = new S_Superellipsoid (0.4,0.4,1.7,0.8,0.1);
  S_Box * box1 = new S_Box (0.2,0.1,0.4);
  S_Box * box2 = new S_Box (2.1,1.1,0.8);
  S_Box * box3 = new S_Box (1.4,4.1,1.2);
  S_Sphere * sphere1 = new S_Sphere (0.3);
  S_Sphere * sphere2 = new S_Sphere (0.5);
  S_Sphere * sphere3 = new S_Sphere (0.2);

  //Positions/Orientations
  super1->setPosition(1.0,0.2,0.5);
  super2->setPosition(-2.2,-1.1,1.3);
  super3->setPosition(0.4,0.4,-1.7);
  box1->setPosition(-0.2,0.1,-0.4);
  box2->setPosition(-2.1,-1.1,0.8);
  box3->setPosition(-2.0,-1.0,1.2);
  sphere1->setPosition(-2.1,1.1,0.8);
  sphere2->setPosition(2.1,1.1,-0.4);
  sphere3->setPosition(2.3,1.1,-0.5);

  super1-> setOrientation(-2.1,1.1,0.8);
  super2-> setOrientation(2.1,1.1,-0.4);
  super3-> setOrientation(2.1,1.1,-0.5);
  box1->   setOrientation(-0.2,0.1,-0.4);
  box2->   setOrientation(-2.1,-1.1,0.8);
  box3->   setOrientation(-2.0,-1.0,1.2);
  sphere1->setOrientation(1.0,0.2,0.5);
  sphere2->setOrientation(-2.2,-1.1,1.3);
  sphere3->setOrientation(0.4,0.4,-1.7);


  //This makes 36 pairs. We can use the scene manager to simplify pairs
  //allocation.

  //Scene manager
  // This is a minimal implementation of a scene manager. It stores
  // pointers and generates automatically collision detection pairs.
  // The library can be used without this scene manager.

  //Adding objects to the manager is simple As fo pairs, the scene does not
  //copy the objects and requires only addresses of the objects. The user
  //creates and destroys the objects separately.
  sObj.addObject(super1);
  sObj.addObject(super2);
  sObj.addObject(super3);
  sObj.addObject(box1);
  sObj.addObject(box2);
  sObj.addObject(box3);
  sObj.addObject(sphere1);
  sObj.addObject(sphere2);
  sObj.addObject(sphere3);

  objName.push_back("super1");
  objName.push_back("super2");
  objName.push_back("super3");
  objName.push_back("box1");
  objName.push_back("box2");
  objName.push_back("box3");
  objName.push_back("sphere1");
  objName.push_back("sphere2");
  objName.push_back("sphere3");
}